

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buckets.hpp
# Opt level: O0

unsigned_long
boost::unordered::detail::mix64_policy<unsigned_long>::new_bucket_count(unsigned_long min)

{
  ulong uVar1;
  unsigned_long min_local;
  undefined8 local_8;
  
  if (min < 5) {
    local_8 = 4;
  }
  else {
    uVar1 = min - 1 >> 1 | min - 1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    uVar1 = uVar1 >> 0x10 | uVar1;
    local_8 = (uVar1 >> 0x20 | uVar1) + 1;
  }
  return local_8;
}

Assistant:

static inline SizeT new_bucket_count(SizeT min) {
            if (min <= 4) return 4;
            --min;
            min |= min >> 1;
            min |= min >> 2;
            min |= min >> 4;
            min |= min >> 8;
            min |= min >> 16;
            min |= min >> 32;
            return min + 1;
        }